

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int libssh2_session_method_pref(LIBSSH2_SESSION *session,int method_type,char *prefs)

{
  char cVar1;
  libssh2_endpoint_data *plVar2;
  char *__s;
  int iVar3;
  size_t sVar4;
  LIBSSH2_KEX_METHOD **methodlist;
  char *pcVar5;
  LIBSSH2_COMMON_METHOD *pLVar6;
  char *pcVar7;
  char *__src;
  char **local_38;
  
  sVar4 = strlen(prefs);
  switch(method_type) {
  case 0:
    local_38 = &session->kex_prefs;
    methodlist = libssh2_kex_methods;
    break;
  case 1:
    local_38 = &session->hostkey_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
    break;
  case 2:
    plVar2 = &session->local;
    goto LAB_001130e1;
  case 3:
    plVar2 = &session->remote;
LAB_001130e1:
    local_38 = &plVar2->crypt_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
    break;
  case 4:
    plVar2 = &session->local;
    goto LAB_0011310b;
  case 5:
    plVar2 = &session->remote;
LAB_0011310b:
    local_38 = &plVar2->mac_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
    break;
  case 6:
    plVar2 = &session->local;
    goto LAB_0011311d;
  case 7:
    plVar2 = &session->remote;
LAB_0011311d:
    local_38 = &plVar2->comp_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
    break;
  case 8:
    local_38 = &(session->local).lang_prefs;
    goto LAB_0011313e;
  case 9:
    local_38 = &(session->remote).lang_prefs;
    goto LAB_0011313e;
  case 10:
    local_38 = &session->sign_algo_prefs;
LAB_0011313e:
    methodlist = (LIBSSH2_KEX_METHOD **)0x0;
    break;
  default:
    pcVar7 = "Invalid parameter specified for method_type";
    iVar3 = -0x22;
    goto LAB_00113272;
  }
  pcVar7 = (char *)(*session->alloc)(sVar4 + 1,&session->abstract);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "Error allocated space for method preferences";
    iVar3 = -6;
  }
  else {
    memcpy(pcVar7,prefs,sVar4 + 1);
    if ((LIBSSH2_CRYPT_METHOD **)methodlist != (LIBSSH2_CRYPT_METHOD **)0x0) {
      cVar1 = *pcVar7;
      __s = pcVar7;
      while (cVar1 != '\0') {
        pcVar5 = strchr(__s,0x2c);
        if (pcVar5 == (char *)0x0) {
          sVar4 = strlen(__s);
          pLVar6 = kex_get_method_by_name(__s,sVar4,(LIBSSH2_COMMON_METHOD **)methodlist);
          if (pLVar6 != (LIBSSH2_COMMON_METHOD *)0x0) break;
          if (pcVar7 < __s) {
            __s[-1] = '\0';
            __src = __s + -1;
          }
          else {
            *__s = '\0';
            __src = __s;
          }
        }
        else {
          pLVar6 = kex_get_method_by_name
                             (__s,(long)pcVar5 - (long)__s,(LIBSSH2_COMMON_METHOD **)methodlist);
          __src = pcVar5 + 1;
          if (pLVar6 == (LIBSSH2_COMMON_METHOD *)0x0) {
            sVar4 = strlen(__s);
            memmove(__s,__src,sVar4 - ((long)pcVar5 - (long)__s));
            __src = __s;
          }
        }
        __s = __src;
        cVar1 = *__src;
      }
    }
    if (*pcVar7 != '\0') {
      if (*local_38 != (char *)0x0) {
        (*session->free)(*local_38,&session->abstract);
      }
      *local_38 = pcVar7;
      return 0;
    }
    (*session->free)(pcVar7,&session->abstract);
    pcVar7 = "The requested method(s) are not currently supported";
    iVar3 = -0x21;
  }
LAB_00113272:
  iVar3 = _libssh2_error(session,iVar3,pcVar7);
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_session_method_pref(LIBSSH2_SESSION * session, int method_type,
                            const char *prefs)
{
    char **prefvar, *s, *newprefs;
    size_t prefs_len = strlen(prefs);
    const LIBSSH2_COMMON_METHOD **mlist;

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        prefvar = &session->kex_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        prefvar = &session->hostkey_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        prefvar = &session->local.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        prefvar = &session->remote.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
        prefvar = &session->local.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_MAC_SC:
        prefvar = &session->remote.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
        prefvar = &session->local.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_COMP_SC:
        prefvar = &session->remote.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)_libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_LANG_CS:
        prefvar = &session->local.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_LANG_SC:
        prefvar = &session->remote.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_SIGN_ALGO:
        prefvar = &session->sign_algo_prefs;
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "Invalid parameter specified for method_type");
    }

    s = newprefs = LIBSSH2_ALLOC(session, prefs_len + 1);
    if(!newprefs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Error allocated space for method preferences");
    }
    memcpy(s, prefs, prefs_len + 1);

    while(s && *s && mlist) {
        char *p = strchr(s, ',');
        size_t method_len = (p ? (size_t)(p - s) : strlen(s));

        if(!kex_get_method_by_name(s, method_len, mlist)) {
            /* Strip out unsupported method */
            if(p) {
                memmove(s, p + 1, strlen(s) - method_len);
            }
            else {
                if(s > newprefs) {
                    *(--s) = '\0';
                }
                else {
                    *s = '\0';
                }
            }
        }
        else {
            s = p ? (p + 1) : NULL;
        }
    }

    if(!*newprefs) {
        LIBSSH2_FREE(session, newprefs);
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "The requested method(s) are not currently "
                              "supported");
    }

    if(*prefvar) {
        LIBSSH2_FREE(session, *prefvar);
    }
    *prefvar = newprefs;

    return 0;
}